

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O0

void __thiscall
sisl::body_centered_cubic<char>::each_site
          (body_centered_cubic<char> *this,
          function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func,bool parallel)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Scalar *i_00;
  Scalar *j_00;
  Scalar *k_00;
  int local_78 [5];
  int local_64;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_60;
  int local_40;
  int local_3c;
  int zmod;
  lattice_site s;
  int k;
  int j;
  int i;
  bool parallel_local;
  function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func_local;
  body_centered_cubic<char> *this_local;
  
  for (k = 0; k <= this->_nx; k = k + 2) {
    for (s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
        s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <=
        this->_ny;
        s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ +
             2) {
      for (s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 0;
          (int)s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          this->_nz;
          s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
               (int)s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
               1) {
        local_3c = 3;
        Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
                  ((Matrix<int,__1,_1,_0,__1,_1> *)&zmod,&local_3c);
        local_40 = (int)s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows % 2;
        local_64 = k + local_40;
        Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator<<
                  (&local_60,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&zmod,&local_64);
        local_78[0] = s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                      ._4_4_ + local_40;
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                            (&local_60,local_78);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                  (this_00,(Scalar *)
                           &s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                            m_rows);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_60);
        i_00 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&zmod,0);
        j_00 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&zmod,1);
        k_00 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&zmod,2);
        bVar1 = in_bound(this,i_00,j_00,k_00);
        if (bVar1) {
          std::function<void_(const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_&)>::operator()
                    (func,(Matrix<int,__1,_1,_0,__1,_1> *)&zmod);
        }
        Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&zmod);
      }
    }
  }
  return;
}

Assistant:

virtual void each_site(const std::function<void(const lattice_site &)> &func, bool parallel = false) {
            #pragma omp parallel for if(parallel)
            for(int i = 0; i <= _nx; i+= 2)
                for(int j = 0; j <= _ny; j+=2)
                    for(int k = 0; k <= _nz; k++) {
                        lattice_site s(3);
                        int zmod = k % 2;
                        s << i+zmod,j+zmod,k;
                        if(in_bound(s[0], s[1],s[2]))
                            func(s);
                    }
        }